

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttrListImpl.cpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::VecAttrListImpl::getValue(VecAttrListImpl *this,char *name)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLCh *toDelete;
  XMLAttr *this_00;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  XMLSize_t getAt;
  XMLCh *pXVar5;
  ArrayJanitor<char16_t> janName;
  ArrayJanitor<char16_t> AStack_38;
  
  toDelete = XMLString::transcode(name,XMLPlatformUtils::fgMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor(&AStack_38,toDelete,XMLPlatformUtils::fgMemoryManager);
  if (this->fCount == 0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    pXVar5 = (XMLCh *)0x0;
    getAt = 0;
    do {
      this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
      pXVar3 = XMLAttr::getQName(this_00);
      if (pXVar3 == toDelete) {
LAB_002b6acd:
        pXVar5 = this_00->fValue;
        break;
      }
      pXVar4 = toDelete;
      if (pXVar3 == (XMLCh *)0x0 || toDelete == (XMLCh *)0x0) {
        if (pXVar3 == (XMLCh *)0x0) {
          if (toDelete == (XMLCh *)0x0) goto LAB_002b6acd;
LAB_002b6abc:
          XVar1 = *pXVar4;
        }
        else {
          XVar1 = *pXVar3;
          if ((toDelete != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_002b6abc;
        }
        if (XVar1 == L'\0') goto LAB_002b6acd;
      }
      else {
        do {
          XVar1 = *pXVar3;
          if (XVar1 == L'\0') goto LAB_002b6abc;
          pXVar3 = pXVar3 + 1;
          XVar2 = *pXVar4;
          pXVar4 = pXVar4 + 1;
        } while (XVar1 == XVar2);
      }
      getAt = getAt + 1;
    } while (getAt < this->fCount);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_38);
  return pXVar5;
}

Assistant:

const XMLCh* VecAttrListImpl::getValue(const char* const name) const
{
    // Temporarily transcode the name for lookup
    XMLCh* wideName = XMLString::transcode(name, XMLPlatformUtils::fgMemoryManager);
    ArrayJanitor<XMLCh> janName(wideName, XMLPlatformUtils::fgMemoryManager);

    //
    //  Search the vector for the attribute with the given name and return
    //  its type.
    //
    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const XMLAttr* curElem = fVector->elementAt(index);

        if (XMLString::equals(curElem->getQName(), wideName))
            return curElem->getValue();
    }
    return 0;
}